

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O3

bool __thiscall
OPNMIDIplay::realTime_NoteOn(OPNMIDIplay *this,uint8_t channel,uint8_t note,uint8_t velocity)

{
  _Rb_tree_header *p_Var1;
  OPN_Operator *pOVar2;
  double dVar3;
  char cVar4;
  pointer pMVar5;
  DebugMessageHook p_Var6;
  pointer pOVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint16_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  MIDIchannel *pMVar17;
  uint8_t uVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  long *plVar22;
  Slot *pSVar23;
  _Base_ptr p_Var24;
  notes_iterator nVar25;
  int64_t iVar26;
  ulong *puVar27;
  Phys *pPVar28;
  uint uVar29;
  int iVar30;
  undefined7 in_register_00000009;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar31;
  char *pcVar32;
  _Base_ptr p_Var33;
  long lVar34;
  size_t c;
  undefined7 in_register_00000031;
  _Base_ptr p_Var35;
  bool bVar36;
  byte bVar37;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  uint uVar38;
  bool bVar39;
  Bank *pBVar40;
  OpnInstMeta *pOVar41;
  ulong uVar42;
  OPN2 *pOVar43;
  bool bVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar48;
  size_t bank;
  Phys voices [2];
  ulong local_f8;
  uint local_ec;
  value_type_conflict5 local_e8;
  ulong local_e0;
  ulong local_d8;
  int local_cc;
  OpnInstMeta *local_c8;
  ulong local_c0;
  MIDIchannel *local_b8;
  OPN2 *local_b0;
  Phys *local_a8;
  uint local_a0;
  uint local_9c;
  OpnTimbre *local_98;
  OPNMIDIplay *local_90;
  Phys local_88;
  undefined1 local_66 [2];
  undefined1 local_64 [17];
  uint8_t uStack_53;
  uint8_t uStack_52;
  uint8_t uStack_51;
  uint8_t uStack_50;
  uint8_t uStack_4f;
  uint8_t uStack_4e;
  uint8_t uStack_4d;
  uint8_t uStack_4c;
  uint8_t uStack_4b;
  uint8_t uStack_4a;
  uint8_t uStack_49;
  uint8_t uStack_48;
  uint8_t uStack_47;
  char cStack_46;
  char cStack_45;
  ulong *local_38;
  
  uVar29 = (uint)CONCAT71(in_register_00000009,velocity);
  pMVar5 = (this->m_midiChannels).
           super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar43 = (this->m_synth).m_p;
  bVar37 = 0x7f;
  if (note < 0x7f) {
    bVar37 = note;
  }
  uVar42 = CONCAT71(in_register_00000031,channel) & 0xffffffff;
  if ((uVar29 != 0) && (pOVar43->m_musicMode == MODE_RSXX)) {
    iVar30 = (int)CONCAT71(in_register_00000031,channel);
    for (ppVar31 = *(pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> **)
                    (pMVar5->_padding2 + (ulong)(uint)(iVar30 * 0x140) + 0x2b);
        (nVar25.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
                        (pMVar5->_padding2 + (ulong)(uint)(iVar30 * 0x140) + 0x3b),
        ppVar31 !=
        (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
        (pMVar5->_padding2 + (ulong)(uint)(iVar30 * 0x140) + 0x3b) &&
        (nVar25.cell_ = ppVar31, (ppVar31->value).note != bVar37));
        ppVar31 = (ppVar31->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next) {
    }
    if (((nVar25.cell_)->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next !=
        (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0) {
      pOVar41 = ((nVar25.cell_)->value).ains;
      if (pOVar41 != (OpnInstMeta *)0x0) {
        iVar20 = (int)pOVar41->midiVelocityOffset + uVar29;
        iVar30 = 1;
        if (1 < iVar20) {
          iVar30 = iVar20;
        }
        uVar18 = '\x7f';
        if (iVar30 < 0x7f) {
          uVar18 = (uint8_t)iVar30;
        }
        ((nVar25.cell_)->value).vol = uVar18;
        noteUpdate(this,uVar42,nVar25,4,-1);
        return false;
      }
      uVar18 = '\x7f';
      if (uVar29 < 0x7f) {
        uVar18 = velocity;
      }
      ((nVar25.cell_)->value).vol = uVar18;
      return false;
    }
  }
  bVar19 = channel & 0xf;
  if (uVar42 <= (ulong)(((long)(this->m_midiChannels).
                               super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 6) *
                       -0x3333333333333333)) {
    bVar19 = channel;
  }
  uVar42 = (ulong)bVar19;
  local_d8 = (ulong)bVar37;
  noteOff(this,uVar42,bVar37,velocity != '\0');
  if (velocity == '\0') {
    return false;
  }
  pMVar5 = (this->m_midiChannels).
           super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar21 = (ulong)((uint)bVar19 * 0x140);
  local_f8 = (ulong)pMVar5->noteAftertouch[uVar21 + 0xffffffffffffffe6];
  bVar36 = (bool)((bVar19 & 0xf) == 9 | pMVar5->_padding2[uVar21 + 0xffffffffffffffff] & 1U);
  local_e8 = 0;
  bVar37 = pMVar5->noteAftertouch[uVar21 + 0xffffffffffffffe5];
  if ((bVar37 != 0 || pMVar5->noteAftertouch[uVar21 + 0xffffffffffffffe4] != '\0') &&
     (local_e8 = (ulong)bVar37 << 8, (this->m_synthMode & 1) == 0)) {
    local_e8 = (value_type_conflict5)
               CONCAT11(bVar37,pMVar5->noteAftertouch[uVar21 + 0xffffffffffffffe4]);
  }
  local_b8 = (MIDIchannel *)(pMVar5->noteAftertouch + uVar21 + -0x28);
  if (bVar36 != false) {
    lVar34 = 0;
    if ((this->m_synthMode & 2) != 0) {
      lVar34 = (ulong)(local_b8->bank_msb == '~') << 7;
    }
    local_e8 = lVar34 + local_f8 + 0x8000;
    local_f8 = local_d8;
  }
  uVar38 = (uint)local_e8;
  if ((local_e8 & 0x7fff) == 0) {
    pOVar41 = &OPN2::m_emptyInstrument;
    bVar44 = false;
    pBVar40 = (Bank *)0x0;
  }
  else {
    plVar22 = (long *)((ulong)(((uint)(local_e8 >> 1) & 0x80 | uVar38 & 0x7f) << 3) +
                      (long)(pOVar43->m_insBanks).m_buckets.
                            super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                            .m_p);
    pBVar40 = (Bank *)0x0;
    do {
      plVar22 = (long *)*plVar22;
      if (plVar22 == (long *)0x0) goto LAB_0015bc5b;
    } while (plVar22[2] != local_e8);
    pBVar40 = (Bank *)(plVar22 + 3);
LAB_0015bc5b:
    bVar44 = pBVar40 == (Bank *)0x0;
    if (bVar44) {
      pOVar41 = &OPN2::m_emptyInstrument;
    }
    else {
      pOVar41 = pBVar40->ins + local_f8;
    }
  }
  local_c0 = uVar42;
  if (((pOVar41->flags & 2) == 0) || ((uVar38 & 0xffffff80) == local_e8)) {
    if (bVar44) {
LAB_0015bca1:
      if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
        this_00 = &this->caugh_missing_banks_melodic;
        if (bVar36 != false) {
          this_00 = &this->caugh_missing_banks_percussion;
        }
        local_c8 = pOVar41;
        pVar48 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::_M_insert_unique(&this_00->_M_t,&local_e8);
        pOVar41 = local_c8;
        if (((undefined1  [16])pVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar32 = "melodic";
          if (bVar36 != false) {
            pcVar32 = "percussion";
          }
          (*(this->hooks).onDebugMessage)
                    ((this->hooks).onDebugMessage_userData,
                     "[%i] Playing missing %s MIDI bank %i (patch %i)",local_c0,pcVar32,
                     local_e8 & 0xffffffffffff7fff,local_f8);
          pOVar41 = local_c8;
        }
      }
    }
  }
  else {
    plVar22 = (long *)((ulong)(uVar38 * 4 & 0x400) +
                      (long)(pOVar43->m_insBanks).m_buckets.
                            super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                            .m_p);
    do {
      plVar22 = (long *)*plVar22;
      if (plVar22 == (long *)0x0) {
        if (pBVar40 == (Bank *)0x0) {
          pBVar40 = (Bank *)0x0;
          goto LAB_0015bca1;
        }
        pOVar41 = pBVar40->ins + local_f8;
        goto LAB_0015bd87;
      }
    } while (plVar22[2] != (ulong)(uVar38 & 0xffffff80));
    pBVar40 = (Bank *)(plVar22 + 3);
    pOVar41 = (OpnInstMeta *)((long)plVar22 + local_f8 * 0x4f + 0x18);
  }
LAB_0015bd87:
  pMVar17 = local_b8;
  uVar42 = local_c0;
  if ((pOVar41->flags & 2) != 0) {
    pSVar23 = (Slot *)(pOVar43->m_insBanks).m_buckets.
                      super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                      .m_p;
    do {
      pSVar23 = pSVar23->next;
      if (pSVar23 == (Slot *)0x0) goto LAB_0015bdb0;
    } while ((pSVar23->value).first != (ulong)((uint)local_e8 & 0x8000));
    pBVar40 = &(pSVar23->value).second;
LAB_0015bdb0:
    if (pBVar40 != (Bank *)0x0) {
      pOVar41 = pBVar40->ins + local_f8;
    }
  }
  iVar20 = (int)pOVar41->midiVelocityOffset + uVar29;
  iVar30 = 1;
  if (1 < iVar20) {
    iVar30 = iVar20;
  }
  local_cc = 0x7f;
  if (iVar30 < 0x7f) {
    local_cc = iVar30;
  }
  if (((bVar36 == false) && (local_e8 != 0)) && ((pOVar41->flags & 2) != 0)) {
    p_Var6 = (this->hooks).onDebugMessage;
    if (p_Var6 != (DebugMessageHook)0x0) {
      p_Var24 = (this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      if (p_Var24 != (_Base_ptr)0x0) {
        p_Var1 = &(this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header;
        p_Var33 = &p_Var1->_M_header;
        do {
          if (*(ulong *)(p_Var24 + 1) >= local_f8) {
            p_Var33 = p_Var24;
          }
          p_Var24 = (&p_Var24->_M_left)[*(ulong *)(p_Var24 + 1) < local_f8];
        } while (p_Var24 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var33 != p_Var1) && (*(ulong *)(p_Var33 + 1) <= local_f8))
        goto LAB_0015be90;
      }
      local_b0 = pOVar43;
      (*p_Var6)((this->hooks).onDebugMessage_userData,
                "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u",
                local_c0 & 0xffffffff,(ulong)local_b8->patch,local_f8);
      pOVar43 = local_b0;
      local_88.chip_chan = (uint16_t)local_f8;
      local_88.ains.OPS[0].data[0] = (uint8_t)(local_f8 >> 0x10);
      local_88.ains.OPS[0].data[1] = (uint8_t)(local_f8 >> 0x18);
      local_88.ains.OPS[0].data[2] = (uint8_t)(local_f8 >> 0x20);
      local_88.ains.OPS[0].data[3] = (uint8_t)(local_f8 >> 0x28);
      local_88.ains.OPS[0].data[4] = (uint8_t)(local_f8 >> 0x30);
      local_88.ains.OPS[0].data[5] = (uint8_t)(local_f8 >> 0x38);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique(&(this->caugh_missing_instruments)._M_t,(value_type_conflict5 *)&local_88);
    }
LAB_0015be90:
    local_e8 = 0;
    local_f8 = (ulong)pMVar17->patch;
  }
  bVar37 = pOVar41->drumTone;
  local_a0 = bVar37 - 0x80;
  if (-1 < (char)bVar37) {
    local_a0 = (uint)bVar37;
  }
  if (bVar37 == 0) {
    local_a0 = (uint)local_d8;
  }
  local_88.chip_chan = 0;
  uVar8 = *(undefined8 *)pOVar41->op[0].OPS;
  local_88.ains.OPS._8_8_ = *(undefined8 *)(pOVar41->op[0].OPS[1].data + 1);
  local_88.ains.OPS._16_8_ = *(undefined8 *)(pOVar41->op[0].OPS[2].data + 2);
  local_88.ains._24_8_ = *(undefined8 *)(pOVar41->op[0].OPS[3].data + 3);
  local_88.ains.OPS[0].data[0] = (uint8_t)uVar8;
  local_88.ains.OPS[0].data[1] = (uint8_t)((ulong)uVar8 >> 8);
  local_88.ains.OPS[0].data[2] = (uint8_t)((ulong)uVar8 >> 0x10);
  local_88.ains.OPS[0].data[3] = (uint8_t)((ulong)uVar8 >> 0x18);
  local_88.ains.OPS[0].data[4] = (uint8_t)((ulong)uVar8 >> 0x20);
  local_88.ains.OPS[0].data[5] = (uint8_t)((ulong)uVar8 >> 0x28);
  local_88.ains.OPS[0].data[6] = (uint8_t)((ulong)uVar8 >> 0x30);
  local_88.ains.OPS[1].data[0] = (uint8_t)((ulong)uVar8 >> 0x38);
  local_66 = (undefined1  [2])0x0;
  local_64._0_16_ = pOVar41->op[1].OPS[0].data[0];
  unique0x00006c80 = *(undefined1 (*) [16])(pOVar41->op[1].OPS[2].data + 2);
  bVar37 = pOVar41->flags & 2;
  p_Var6 = (this->hooks).onDebugMessage;
  local_c8 = pOVar41;
  if (p_Var6 != (DebugMessageHook)0x0) {
    p_Var24 = (this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    p_Var1 = &(this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header;
    p_Var33 = &p_Var1->_M_header;
    p_Var35 = &p_Var1->_M_header;
    if (p_Var24 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var24 + 1) >= local_f8) {
          p_Var33 = p_Var24;
        }
        p_Var24 = (&p_Var24->_M_left)[*(ulong *)(p_Var24 + 1) < local_f8];
      } while (p_Var24 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var33 != p_Var1) &&
         (p_Var35 = p_Var33, local_f8 < *(ulong *)(p_Var33 + 1))) {
        p_Var35 = &p_Var1->_M_header;
      }
    }
    if (((_Rb_tree_header *)p_Var35 == p_Var1) && (bVar37 != 0)) {
      (*p_Var6)((this->hooks).onDebugMessage_userData,"[%i] Playing missing instrument %i",
                uVar42 & 0xffffffff,local_f8);
      local_e0 = local_f8;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique(&(this->caugh_missing_instruments)._M_t,&local_e0);
      goto LAB_0015bf9d;
    }
  }
  if (bVar37 == 0) {
    local_98 = &local_88.ains;
    puVar27 = &local_e0;
    local_e0 = CONCAT44(local_e0._4_4_,0xffffffff);
    local_ec = 0xffffffff;
    local_a8 = &local_88;
    bVar44 = false;
    uVar42 = CONCAT71((int7)(local_f8 >> 8),1);
    local_b0 = pOVar43;
    local_90 = this;
    do {
      uVar29 = (uint)local_e0;
      if (bVar44) {
        auVar47[0] = -(local_64[0] == local_88.ains.OPS[0].data[0]);
        auVar47[1] = -(local_64[1] == local_88.ains.OPS[0].data[1]);
        auVar47[2] = -(local_64[2] == local_88.ains.OPS[0].data[2]);
        auVar47[3] = -(local_64[3] == local_88.ains.OPS[0].data[3]);
        auVar47[4] = -(local_64[4] == local_88.ains.OPS[0].data[4]);
        auVar47[5] = -(local_64[5] == local_88.ains.OPS[0].data[5]);
        auVar47[6] = -(local_64[6] == local_88.ains.OPS[0].data[6]);
        auVar47[7] = -(local_64[7] == local_88.ains.OPS[1].data[0]);
        auVar47[8] = -(local_64[8] == local_88.ains.OPS[1].data[1]);
        auVar47[9] = -(local_64[9] == local_88.ains.OPS[1].data[2]);
        auVar47[10] = -(local_64[10] == local_88.ains.OPS[1].data[3]);
        auVar47[0xb] = -(local_64[0xb] == local_88.ains.OPS[1].data[4]);
        auVar47[0xc] = -(local_64[0xc] == local_88.ains.OPS[1].data[5]);
        auVar47[0xd] = -(local_64[0xd] == local_88.ains.OPS[1].data[6]);
        auVar47[0xe] = -(local_64[0xe] == local_88.ains.OPS[2].data[0]);
        auVar47[0xf] = -(local_64[0xf] == local_88.ains.OPS[2].data[1]);
        auVar46[0] = -(local_64[0x10] == local_88.ains.OPS[2].data[2]);
        auVar46[1] = -(uStack_53 == local_88.ains.OPS[2].data[3]);
        auVar46[2] = -(uStack_52 == local_88.ains.OPS[2].data[4]);
        auVar46[3] = -(uStack_51 == local_88.ains.OPS[2].data[5]);
        auVar46[4] = -(uStack_50 == local_88.ains.OPS[2].data[6]);
        auVar46[5] = -(uStack_4f == local_88.ains.OPS[3].data[0]);
        auVar46[6] = -(uStack_4e == local_88.ains.OPS[3].data[1]);
        auVar46[7] = -(uStack_4d == local_88.ains.OPS[3].data[2]);
        auVar46[8] = -(uStack_4c == local_88.ains.OPS[3].data[3]);
        auVar46[9] = -(uStack_4b == local_88.ains.OPS[3].data[4]);
        auVar46[10] = -(uStack_4a == local_88.ains.OPS[3].data[5]);
        auVar46[0xb] = -(uStack_49 == local_88.ains.OPS[3].data[6]);
        auVar46[0xc] = -(uStack_48 == local_88.ains.fbalg);
        auVar46[0xd] = -(uStack_47 == local_88.ains.lfosens);
        auVar46[0xe] = -(cStack_46 == (char)local_88.ains.noteOffset);
        auVar46[0xf] = -(cStack_45 == local_88.ains.noteOffset._1_1_);
        auVar46 = auVar46 & auVar47;
        if (((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) == 0xffff) ||
           ((uint)local_e0 == 0xffffffff)) goto LAB_0015c165;
      }
      uVar38 = pOVar43->m_numChannels;
      local_38 = puVar27;
      if ((ulong)uVar38 == 0) {
LAB_0015c10c:
        p_Var6 = (this->hooks).onDebugMessage;
        if (p_Var6 != (DebugMessageHook)0x0) {
          (*p_Var6)((this->hooks).onDebugMessage_userData,
                    "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",local_e8
                    ,(ulong)local_b8->patch,local_d8,local_c0);
        }
      }
      else {
        local_9c = (uint)uVar42;
        c = 0xffffffff;
        iVar30 = -0x7fffffff;
        uVar42 = 0;
        do {
          if (!(bool)(bVar44 & uVar29 == (uint)uVar42)) {
            iVar26 = calculateChipChannelGoodness(local_90,uVar42,local_a8);
            if (iVar30 < iVar26) {
              c = uVar42 & 0xffffffff;
            }
            if (iVar30 < iVar26) {
              iVar30 = (int)iVar26;
            }
          }
          this = local_90;
          pOVar43 = local_b0;
          uVar42 = uVar42 + 1;
        } while (uVar38 != uVar42);
        uVar42 = (ulong)local_9c;
        if ((int)c < 0) goto LAB_0015c10c;
        prepareChipChannelForNewNote(local_90,c,local_a8);
        *(int *)local_38 = (int)c;
      }
      bVar44 = true;
      puVar27 = (ulong *)&local_ec;
      local_a8 = (Phys *)local_66;
      uVar21 = uVar42 & 1;
      uVar42 = 0;
    } while (uVar21 != 0);
LAB_0015c165:
    pMVar17 = local_b8;
    bVar44 = -1 < (int)(local_ec & (uint)local_e0);
    if (bVar44) {
      uVar18 = (uint8_t)local_cc;
      if (local_b8->softPedal == true) {
        fVar45 = floorf((float)(int)(char)(uint8_t)local_cc * 0.8);
        uVar18 = (uint8_t)(int)fVar45;
      }
      uVar42 = local_d8;
      nVar25 = MIDIchannel::ensure_find_or_create_activenote(pMVar17,(uint)local_d8);
      ((nVar25.cell_)->value).vol = uVar18;
      ((nVar25.cell_)->value).vibrato = pMVar17->noteAftertouch[uVar42];
      ((nVar25.cell_)->value).noteTone = (int16_t)local_a0;
      ((nVar25.cell_)->value).currentTone = (double)(int)local_a0;
      ((nVar25.cell_)->value).glideRate = INFINITY;
      ((nVar25.cell_)->value).midiins = local_f8;
      ((nVar25.cell_)->value).isPercussion = bVar36;
      ((nVar25.cell_)->value).isBlank = false;
      ((nVar25.cell_)->value).isOnExtendedLifeTime = false;
      ((nVar25.cell_)->value).ttl = 0.0;
      ((nVar25.cell_)->value).ains = local_c8;
      ((nVar25.cell_)->value).chip_channels_count = 0;
      cVar4 = pMVar17->portamentoSource;
      dVar3 = pMVar17->portamentoRate;
      pMVar17->portamentoSource = (int8_t)uVar42;
      if ((byte)((bVar36 ^ 1U) & -1 < cVar4 & dVar3 < INFINITY & pMVar17->portamentoEnable) == 1) {
        ((nVar25.cell_)->value).currentTone = (double)(int)cVar4;
        ((nVar25.cell_)->value).glideRate = dVar3;
        pMVar17->gliding_note_count = pMVar17->gliding_note_count + 1;
      }
      if (bVar36 != false) {
        ((nVar25.cell_)->value).ttl = 0.03;
        pMVar17->extended_note_count = pMVar17->extended_note_count + 1;
      }
      puVar27 = &local_e0;
      bVar36 = true;
      do {
        bVar39 = bVar36;
        if (-1 < (int)*puVar27) {
          pPVar28 = MIDIchannel::NoteInfo::phys_ensure_find_or_create
                              (&(nVar25.cell_)->value,(uint16_t)(int)*puVar27);
          uVar8 = *(undefined8 *)(local_98->OPS[1].data + 1);
          uVar9 = *(undefined8 *)(local_98->OPS[2].data + 2);
          uVar10 = *(undefined8 *)(local_98->OPS[3].data + 3);
          *(undefined8 *)(pPVar28->ains).OPS = *(undefined8 *)local_98->OPS;
          *(undefined8 *)((pPVar28->ains).OPS[1].data + 1) = uVar8;
          *(undefined8 *)((pPVar28->ains).OPS[2].data + 2) = uVar9;
          *(undefined8 *)((pPVar28->ains).OPS[3].data + 3) = uVar10;
        }
        local_98 = (OpnTimbre *)(local_66 + 2);
        puVar27 = (ulong *)&local_ec;
        bVar36 = false;
      } while (bVar39);
      noteUpdate(this,local_c0,nVar25,0xf,-1);
      pPVar28 = &local_88;
      puVar27 = &local_e0;
      bVar36 = true;
      do {
        bVar39 = bVar36;
        lVar34 = (long)(int)*puVar27;
        if (-1 < lVar34) {
          pOVar7 = (this->m_chipChannels).
                   super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pOVar7[lVar34].recent_ins.ains.noteOffset = (pPVar28->ains).noteOffset;
          uVar11 = pPVar28->chip_chan;
          uVar18 = (pPVar28->ains).OPS[0].data[0];
          uVar12 = (pPVar28->ains).OPS[0].data[1];
          uVar13 = (pPVar28->ains).OPS[0].data[2];
          uVar14 = (pPVar28->ains).OPS[0].data[3];
          uVar15 = (pPVar28->ains).OPS[0].data[4];
          uVar16 = (pPVar28->ains).OPS[0].data[5];
          uVar8 = *(undefined8 *)((pPVar28->ains).OPS[0].data + 6);
          uVar9 = *(undefined8 *)((pPVar28->ains).OPS[3].data + 1);
          pOVar2 = pOVar7[lVar34].recent_ins.ains.OPS + 2;
          *(undefined8 *)pOVar2 = *(undefined8 *)((pPVar28->ains).OPS + 2);
          *(undefined8 *)(pOVar2[1].data + 1) = uVar9;
          pPVar28 = &pOVar7[lVar34].recent_ins;
          pPVar28->chip_chan = uVar11;
          (pPVar28->ains).OPS[0].data[0] = uVar18;
          (pPVar28->ains).OPS[0].data[1] = uVar12;
          (pPVar28->ains).OPS[0].data[2] = uVar13;
          (pPVar28->ains).OPS[0].data[3] = uVar14;
          (pPVar28->ains).OPS[0].data[4] = uVar15;
          (pPVar28->ains).OPS[0].data[5] = uVar16;
          *(undefined8 *)((pPVar28->ains).OPS[0].data + 6) = uVar8;
          OpnChannel::addAge((this->m_chipChannels).
                             super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar34,0);
        }
        pPVar28 = (Phys *)local_66;
        puVar27 = (ulong *)&local_ec;
        bVar36 = false;
      } while (bVar39);
      return bVar44;
    }
    return bVar44;
  }
LAB_0015bf9d:
  uVar42 = local_d8;
  nVar25 = MIDIchannel::ensure_find_or_create_activenote(pMVar17,(uint)local_d8);
  ((nVar25.cell_)->value).isBlank = true;
  ((nVar25.cell_)->value).isOnExtendedLifeTime = false;
  ((nVar25.cell_)->value).chip_channels_count = 0;
  ((nVar25.cell_)->value).ttl = 0.0;
  ((nVar25.cell_)->value).ains = (OpnInstMeta *)0x0;
  pMVar17->portamentoSource = (int8_t)uVar42;
  return false;
}

Assistant:

bool OPNMIDIplay::realTime_NoteOn(uint8_t channel, uint8_t note, uint8_t velocity)
{
    Synth &synth = *m_synth;

    if(note >= 127)
        note = 127;

    if((synth.m_musicMode == Synth::MODE_RSXX) && (velocity != 0))
    {
        // Check if this is just a note after-touch
        MIDIchannel::notes_iterator i = m_midiChannels[channel].find_activenote(note);
        if(!i.is_end())
        {
            MIDIchannel::NoteInfo &ni = i->value;
            const int veloffset = ni.ains ? ni.ains->midiVelocityOffset : 0;
            velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));
            ni.vol = velocity;
            if(ni.ains)
                noteUpdate(channel, i, Upd_Volume);
            return false;
        }
    }

    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    noteOff(channel, note, velocity != 0);
    // On Note on, Keyoff the note first, just in case keyoff
    // was omitted; this fixes Dance of sugar-plum fairy
    // by Microsoft. Now that we've done a Keyoff,
    // check if we still need to do a Keyon.
    // vol=0 and event 8x are both Keyoff-only.
    if(velocity == 0)
        return false;

    MIDIchannel &midiChan = m_midiChannels[channel];

    size_t midiins = midiChan.patch;
    bool isPercussion = (channel % 16 == 9) || midiChan.is_xg_percussion;

    size_t bank = 0;
    if(midiChan.bank_msb || midiChan.bank_lsb)
    {
        if((m_synthMode & Mode_GS) != 0) //in GS mode ignore LSB
            bank = (midiChan.bank_msb * 256);
        else
            bank = (midiChan.bank_msb * 256) + midiChan.bank_lsb;
    }

    if(isPercussion)
    {
        // == XG bank numbers ==
        // 0x7E00 - XG "SFX Kits" SFX1/SFX2 channel (16128 signed decimal)
        // 0x7F00 - XG "Drum Kits" Percussion channel (16256 signed decimal)

        // MIDI instrument defines the patch:
        if((m_synthMode & Mode_XG) != 0)
        {
            // Let XG SFX1/SFX2 bank will go in 128...255 range of LSB in WOPN file)
            // Let XG Percussion bank will use (0...127 LSB range in WOPN file)

            // Choose: SFX or Drum Kits
            bank = midiins + ((midiChan.bank_msb == 0x7E) ? 128 : 0);
        }
        else
        {
            bank = midiins;
        }
        midiins = note; // Percussion instrument
    }

    if(isPercussion)
        bank += Synth::PercussionTag;

    const OpnInstMeta *ains = &Synth::m_emptyInstrument;

    //Set bank bank
    const Synth::Bank *bnk = NULL;
    bool caughtMissingBank = false;
    if((bank & ~static_cast<uint16_t>(Synth::PercussionTag)) > 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
        else
            caughtMissingBank = true;
    }

    //Or fall back to bank ignoring LSB (GS/XG)
    if(ains->flags & OpnInstMeta::Flag_NoSound)
    {
        size_t fallback = bank & ~(size_t)0x7F;
        if(fallback != bank)
        {
            Synth::BankMap::iterator b = synth.m_insBanks.find(fallback);
            caughtMissingBank = false;
            if(b != synth.m_insBanks.end())
                bnk = &b->second;
            if(bnk)
                ains = &bnk->ins[midiins];
            else
                caughtMissingBank = true;
        }
    }

    if(caughtMissingBank && hooks.onDebugMessage)
    {
        std::set<size_t> &missing = (isPercussion) ?
                                    caugh_missing_banks_percussion : caugh_missing_banks_melodic;
        const char *text = (isPercussion) ?
                           "percussion" : "melodic";
        if(missing.insert(bank).second)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                 "[%i] Playing missing %s MIDI bank %i (patch %i)",
                                 channel, text, (bank & ~static_cast<uint16_t>(Synth::PercussionTag)), midiins);
        }
    }

    //Or fall back to first bank
    if((ains->flags & OpnInstMeta::Flag_NoSound) != 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank & Synth::PercussionTag);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
    }

    const int veloffset = ains->midiVelocityOffset;
    velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));

    int32_t tone = note;
    if(!isPercussion && (bank > 0)) // For non-zero banks
    {
        if(ains->flags & OpnInstMeta::Flag_NoSound)
        {
            if(hooks.onDebugMessage)
            {
                if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)))
                {
                    hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u", channel, midiChan.patch, midiins, bank);
                    caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
                }
            }
            bank = 0;
            midiins = midiChan.patch;
        }
    }

    if(ains->drumTone)
    {
        if(ains->drumTone >= 128)
            tone = ains->drumTone - 128;
        else
            tone = ains->drumTone;
    }

    MIDIchannel::NoteInfo::Phys voices[MIDIchannel::NoteInfo::MaxNumPhysChans] = {
        {0, ains->op[0], /*false*/},
        {0, ains->op[1], /*pseudo_4op*/},
    };
    //bool pseudo_4op = ains.flags & opnInstMeta::Flag_Pseudo8op;
    //if((opn.AdlPercussionMode == 1) && PercussionMap[midiins & 0xFF]) i[1] = i[0];

    bool isBlankNote = (ains->flags & OpnInstMeta::Flag_NoSound) != 0;

    if(hooks.onDebugMessage)
    {
        if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)) && isBlankNote)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Playing missing instrument %i", channel, midiins);
            caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
        }
    }

    if(isBlankNote)
    {
        // Don't even try to play the blank instrument! But, insert the dummy note.
        MIDIchannel::notes_iterator i = midiChan.ensure_find_or_create_activenote(note);
        MIDIchannel::NoteInfo &dummy = i->value;
        dummy.isBlank = true;
        dummy.isOnExtendedLifeTime = false;
        dummy.ttl = 0;
        dummy.ains = NULL;
        dummy.chip_channels_count = 0;
        // Record the last note on MIDI channel as source of portamento
        midiChan.portamentoSource = static_cast<int8_t>(note);
        return false;
    }

    // Allocate OPN2 channel (the physical sound channel for the note)
    int32_t adlchannel[MIDIchannel::NoteInfo::MaxNumPhysChans] = { -1, -1 };

    for(uint32_t ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        if(ccount == 1)
        {
            if(voices[0] == voices[1])
                break; // No secondary channel
            if(adlchannel[0] == -1)
                break; // No secondary if primary failed
        }

        int32_t c = -1;
        int32_t bs = -0x7FFFFFFFl;

        for(size_t a = 0; a < static_cast<size_t>(synth.m_numChannels); ++a)
        {
            if(ccount == 1 && static_cast<int32_t>(a) == adlchannel[0]) continue;
            // ^ Don't use the same channel for primary&secondary
            // ===== Kept for future pseudo-8-op mode
            //if(voices[0] == voices[1] || pseudo_4op)
            //{
            //    // Only use regular channels
            //    uint8_t expected_mode = 0;
            //    if(opn.AdlPercussionMode == 1)
            //    {
            //        if(cmf_percussion_mode)
            //            expected_mode = MidCh < 11 ? 0 : (3 + MidCh - 11); // CMF
            //        else
            //            expected_mode = PercussionMap[midiins & 0xFF];
            //    }
            //    if(opn.four_op_category[a] != expected_mode)
            //        continue;
            //}
            int64_t s = calculateChipChannelGoodness(a, voices[ccount]);
            if(s > bs)
            {
                bs = static_cast<int32_t>(s);    // Best candidate wins
                c = static_cast<int32_t>(a);
            }
        }

        if(c < 0)
        {
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                     "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",
                                     bank, midiChan.patch, note, channel);
            continue; // Could not play this note. Ignore it.
        }

        prepareChipChannelForNewNote(static_cast<size_t>(c), voices[ccount]);
        adlchannel[ccount] = c;
    }

    if(adlchannel[0] < 0 && adlchannel[1] < 0)
    {
        // The note could not be played, at all.
        return false;
    }

    //if(hooks.onDebugMessage)
    //    hooks.onDebugMessage(hooks.onDebugMessage_userData, "i1=%d:%d, i2=%d:%d", i[0],adlchannel[0], i[1],adlchannel[1]);

    if(midiChan.softPedal) // Apply Soft Pedal level reducing
        velocity = static_cast<uint8_t>(std::floor(static_cast<float>(velocity) * 0.8f));

    // Allocate active note for MIDI channel
    MIDIchannel::notes_iterator ir = midiChan.ensure_find_or_create_activenote(note);
    MIDIchannel::NoteInfo &ni = ir->value;
    ni.vol     = velocity;
    ni.vibrato = midiChan.noteAftertouch[note];
    ni.noteTone = static_cast<int16_t>(tone);
    ni.currentTone = tone;
    ni.glideRate = HUGE_VAL;
    ni.midiins = midiins;
    ni.isPercussion = isPercussion;
    ni.isBlank = isBlankNote;
    ni.isOnExtendedLifeTime = false;
    ni.ttl = 0;
    ni.ains = ains;
    ni.chip_channels_count = 0;

    int8_t currentPortamentoSource = midiChan.portamentoSource;
    double currentPortamentoRate = midiChan.portamentoRate;
    bool portamentoEnable =
        midiChan.portamentoEnable && currentPortamentoRate != HUGE_VAL && !isPercussion;
    // Record the last note on MIDI channel as source of portamento
    midiChan.portamentoSource = static_cast<int8_t>(note);
    // midiChan.portamentoSource = portamentoEnable ? (int8_t)note : (int8_t)-1;

    // Enable gliding on portamento note
    if (portamentoEnable && currentPortamentoSource >= 0)
    {
        ni.currentTone = currentPortamentoSource;
        ni.glideRate = currentPortamentoRate;
        ++midiChan.gliding_note_count;
    }

    // Enable life time extension on percussion note
    if (isPercussion)
    {
        ni.ttl = drum_note_min_time;
        ++midiChan.extended_note_count;
    }

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        uint16_t chipChan = static_cast<uint16_t>(adlchannel[ccount]);
        ni.phys_ensure_find_or_create(chipChan)->assign(voices[ccount]);
    }

    noteUpdate(channel, ir, Upd_All | Upd_Patch);

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        m_chipChannels[c].recent_ins = voices[ccount];
        m_chipChannels[c].addAge(0);
    }

    return true;
}